

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

result<sockpp::none> * __thiscall
sockpp::stream_socket::read_timeout
          (result<sockpp::none> *__return_storage_ptr__,stream_socket *this,microseconds *to)

{
  timeval tv;
  timeval local_20;
  
  local_20 = to_timeval(to);
  socket::set_option(__return_storage_ptr__,&this->super_socket,1,0x14,&local_20,0x10);
  return __return_storage_ptr__;
}

Assistant:

result<> stream_socket::read_timeout(const microseconds& to) {
    auto tv =
#if defined(_WIN32)
        DWORD(duration_cast<milliseconds>(to).count());
#else
        to_timeval(to);
#endif
    return set_option(SOL_SOCKET, SO_RCVTIMEO, tv);
}